

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::MarkLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t header_id;
  uint32_t merge_id;
  Instruction *this_00;
  size_type sVar4;
  StructuredCFGAnalysis *this_01;
  pointer ppVar5;
  __ireturn_type _Var6;
  uint32_t live_lab_id;
  BasicBlock *block;
  uint32_t icnt;
  uint32_t sel_val;
  bool condVal;
  uint32_t local_c0;
  undefined4 uStack_bc;
  pointer local_b8;
  code *local_b0;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> stack;
  uint32_t case_val;
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  conditions_to_simplify;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  blocks_with_backedge;
  
  conditions_to_simplify.
  super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  conditions_to_simplify.
  super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conditions_to_simplify.
  super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blocks_with_backedge._M_h._M_buckets = &blocks_with_backedge._M_h._M_single_bucket;
  blocks_with_backedge._M_h._M_bucket_count = 1;
  blocks_with_backedge._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  blocks_with_backedge._M_h._M_element_count = 0;
  blocks_with_backedge._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  blocks_with_backedge._M_h._M_rehash_policy._M_next_resize = 0;
  blocks_with_backedge._M_h._M_single_bucket = (__node_base_ptr)0x0;
  stack.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _condVal = (((func->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t;
  std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)&stack
             ,(BasicBlock **)&condVal);
  do {
    while( true ) {
      do {
        if (stack.
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            stack.
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar1 = false;
          for (ppVar5 = conditions_to_simplify.
                        super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ppVar5 != conditions_to_simplify.
                        super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar5 = ppVar5 + -1) {
            bVar2 = SimplifyBranch(this,ppVar5[-1].first,ppVar5[-1].second);
            bVar1 = (bool)(bVar1 | bVar2);
          }
          std::
          _Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
          ~_Vector_base(&stack.
                         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       );
          std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&blocks_with_backedge._M_h);
          std::
          _Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
          ::~_Vector_base(&conditions_to_simplify.
                           super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
                         );
          return bVar1;
        }
        block = stack.
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1];
        stack.
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             stack.
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        _Var6 = std::__detail::
                _Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)live_blocks,&block);
      } while (((undefined1  [16])_Var6 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      uVar3 = BasicBlock::ContinueBlockIdIfAny(block);
      if (uVar3 != 0) {
        header_id = BasicBlock::id(block);
        merge_id = BasicBlock::MergeBlockIdIfAny(block);
        AddBlocksWithBackEdge(this,uVar3,header_id,merge_id,&blocks_with_backedge);
      }
      this_00 = BasicBlock::terminator(block);
      live_lab_id = 0;
      if (this_00->opcode_ == OpSwitch) break;
      if (this_00->opcode_ == OpBranchConditional) {
        uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
        bVar1 = GetConstCondition(this,uVar3,(bool *)((_Any_data *)&condVal)->_M_pod_data);
        if (bVar1) {
          live_lab_id = Instruction::GetSingleWordInOperand(this_00,2 - condVal);
        }
        goto LAB_004a2478;
      }
LAB_004a24ba:
      _condVal = &stack;
      local_b0 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                 ::_M_invoke;
      local_b8 = (pointer)std::
                          _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                          ::_M_manager;
      _local_c0 = this;
      BasicBlock::ForEachSuccessorLabel(block,(function<void_(unsigned_int)> *)&condVal);
      if (local_b8 != (pointer)0x0) {
        (*(code *)local_b8)((_Any_data *)&condVal,(_Any_data *)&condVal,__destroy_functor);
      }
    }
    uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
    bVar1 = GetConstInteger(this,uVar3,&sel_val);
    if (bVar1) {
      icnt = 0;
      _local_c0 = (DeadBranchElimPass *)0x0;
      _condVal = ::operator_new(0x20);
      ((BasicBlock *)_condVal)->function_ = (Function *)&icnt;
      (((BasicBlock *)_condVal)->label_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (Instruction *)&case_val;
      (((BasicBlock *)_condVal)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
      _vptr_IntrusiveList = (_func_int **)&sel_val;
      (((BasicBlock *)_condVal)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&live_lab_id;
      local_b0 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                 ::_M_invoke;
      local_b8 = (pointer)std::
                          _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                          ::_M_manager;
      Instruction::WhileEachInOperand(this_00,(function<bool_(unsigned_int_*)> *)&condVal);
      if (local_b8 != (pointer)0x0) {
        (*(code *)local_b8)((_Any_data *)&condVal,(_Any_data *)&condVal,__destroy_functor);
      }
    }
LAB_004a2478:
    if (live_lab_id == 0) goto LAB_004a24ba;
    sVar4 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&blocks_with_backedge._M_h,&block);
    uVar3 = live_lab_id;
    if (sVar4 != 0) {
      this_01 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
      uVar3 = BasicBlock::id(block);
      uVar3 = StructuredCFGAnalysis::ContainingLoop(this_01,uVar3);
      if (live_lab_id != uVar3) goto LAB_004a24ba;
    }
    _condVal = block;
    local_c0 = uVar3;
    std::
    vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
    ::emplace_back<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>
              ((vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
                *)&conditions_to_simplify,
               (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)&condVal);
    _condVal = GetParentBlock(this,live_lab_id);
    std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
    emplace_back<spvtools::opt::BasicBlock*>
              ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
               &stack,(BasicBlock **)&condVal);
  } while( true );
}

Assistant:

bool DeadBranchElimPass::MarkLiveBlocks(
    Function* func, std::unordered_set<BasicBlock*>* live_blocks) {
  std::vector<std::pair<BasicBlock*, uint32_t>> conditions_to_simplify;
  std::unordered_set<BasicBlock*> blocks_with_backedge;
  std::vector<BasicBlock*> stack;
  stack.push_back(&*func->begin());
  bool modified = false;
  while (!stack.empty()) {
    BasicBlock* block = stack.back();
    stack.pop_back();

    // Live blocks doubles as visited set.
    if (!live_blocks->insert(block).second) continue;

    uint32_t cont_id = block->ContinueBlockIdIfAny();
    if (cont_id != 0) {
      AddBlocksWithBackEdge(cont_id, block->id(), block->MergeBlockIdIfAny(),
                            &blocks_with_backedge);
    }

    Instruction* terminator = block->terminator();
    uint32_t live_lab_id = 0;
    // Check if the terminator has a single valid successor.
    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      bool condVal;
      if (GetConstCondition(terminator->GetSingleWordInOperand(0u), &condVal)) {
        live_lab_id = terminator->GetSingleWordInOperand(
            condVal ? kBranchCondTrueLabIdInIdx : kBranchCondFalseLabIdInIdx);
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      uint32_t sel_val;
      if (GetConstInteger(terminator->GetSingleWordInOperand(0u), &sel_val)) {
        // Search switch operands for selector value, set live_lab_id to
        // corresponding label, use default if not found.
        uint32_t icnt = 0;
        uint32_t case_val;
        terminator->WhileEachInOperand(
            [&icnt, &case_val, &sel_val, &live_lab_id](const uint32_t* idp) {
              if (icnt == 1) {
                // Start with default label.
                live_lab_id = *idp;
              } else if (icnt > 1) {
                if (icnt % 2 == 0) {
                  case_val = *idp;
                } else {
                  if (case_val == sel_val) {
                    live_lab_id = *idp;
                    return false;
                  }
                }
              }
              ++icnt;
              return true;
            });
      }
    }

    // Don't simplify back edges unless it becomes a branch to the header. Every
    // loop must have exactly one back edge to the loop header, so we cannot
    // remove it.
    bool simplify = false;
    if (live_lab_id != 0) {
      if (!blocks_with_backedge.count(block)) {
        // This is not a back edge.
        simplify = true;
      } else {
        const auto& struct_cfg_analysis = context()->GetStructuredCFGAnalysis();
        uint32_t header_id = struct_cfg_analysis->ContainingLoop(block->id());
        if (live_lab_id == header_id) {
          // The new branch will be a branch to the header.
          simplify = true;
        }
      }
    }

    if (simplify) {
      conditions_to_simplify.push_back({block, live_lab_id});
      stack.push_back(GetParentBlock(live_lab_id));
    } else {
      // All successors are live.
      const auto* const_block = block;
      const_block->ForEachSuccessorLabel([&stack, this](const uint32_t label) {
        stack.push_back(GetParentBlock(label));
      });
    }
  }

  // Traverse |conditions_to_simplify| in reverse order.  This is done so that
  // we simplify nested constructs before simplifying the constructs that
  // contain them.
  for (auto b = conditions_to_simplify.rbegin();
       b != conditions_to_simplify.rend(); ++b) {
    modified |= SimplifyBranch(b->first, b->second);
  }

  return modified;
}